

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O2

void matras_dealloc(matras *m)

{
  size_t sVar1;
  void *ext;
  void *ext_00;
  uint uVar2;
  uint id;
  
  sVar1 = (m->head).block_count;
  if (sVar1 == 0) {
    __assert_fail("m->head.block_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x109,"void matras_dealloc(struct matras *)");
  }
  id = (int)sVar1 - 1;
  matras_touch(m,id);
  (m->head).block_count = (ulong)id;
  uVar2 = m->mask1 & id;
  if ((uVar2 == 0 || id == 0) || (m->mask2 & uVar2) == 0) {
    ext = (m->head).root;
    ext_00 = *(void **)((long)ext + (ulong)(id >> ((byte)m->shift1 & 0x1f)) * 8);
    if ((m->mask2 & uVar2) == 0) {
      matras_free_extent(m,*(void **)((long)ext_00 + (ulong)(uVar2 >> ((byte)m->shift2 & 0x1f)) * 8)
                        );
    }
    if (uVar2 == 0) {
      matras_free_extent(m,ext_00);
    }
    if (id == 0) {
      matras_free_extent(m,ext);
      return;
    }
  }
  return;
}

Assistant:

void
matras_dealloc(struct matras *m)
{
	assert(m->head.block_count);
	matras_id_t id = m->head.block_count - 1;
	matras_touch(m, id);
	m->head.block_count = id;
	/* Current block_count is the ID of deleting block */

	/* See "Shifts and masks explanation" for details */
	/* Deleting extents in same way (but reverse order) like in matras_alloc
	 * See matras_alloc for details. */
	bool extent1_free = !id;
	matras_id_t n1 = id >> m->shift1;
	id &= m->mask1;
	bool extent2_free = !id;
	matras_id_t n2 = id >> m->shift2;
	id &= m->mask2;
	bool extent3_free = !id;

	if (extent1_free || extent2_free || extent3_free) {
		void **extent1, **extent2, *extent3;
		extent1 = (void **)m->head.root;
		extent2 = (void **)extent1[n1];
		extent3 = extent2[n2];
		if (extent3_free)
			matras_free_extent(m, extent3);
		if (extent2_free)
			matras_free_extent(m, extent2);
		if (extent1_free)
			matras_free_extent(m, extent1);
	}
}